

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

StringRefType *
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode)

{
  StringRefType *pSStack_10;
  SchemaErrorCode schemaErrorCode_local;
  
  switch(schemaErrorCode) {
  case kSchemaErrorStartUnknown:
    pSStack_10 = GetStartUnknownString();
    break;
  case kSchemaErrorRefPlainName:
    pSStack_10 = GetRefPlainNameString();
    break;
  case kSchemaErrorRefInvalid:
    pSStack_10 = GetRefInvalidString();
    break;
  case kSchemaErrorRefPointerInvalid:
    pSStack_10 = GetRefPointerInvalidString();
    break;
  case kSchemaErrorRefUnknown:
    pSStack_10 = GetRefUnknownString();
    break;
  case kSchemaErrorRefCyclical:
    pSStack_10 = GetRefCyclicalString();
    break;
  case kSchemaErrorRefNoRemoteProvider:
    pSStack_10 = GetRefNoRemoteProviderString();
    break;
  case kSchemaErrorRefNoRemoteSchema:
    pSStack_10 = GetRefNoRemoteSchemaString();
    break;
  case kSchemaErrorRegexInvalid:
    pSStack_10 = GetRegexInvalidString();
    break;
  case kSchemaErrorSpecUnknown:
    pSStack_10 = GetSpecUnknownString();
    break;
  case kSchemaErrorSpecUnsupported:
    pSStack_10 = GetSpecUnsupportedString();
    break;
  case kSchemaErrorSpecIllegal:
    pSStack_10 = GetSpecIllegalString();
    break;
  case kSchemaErrorReadOnlyAndWriteOnly:
    pSStack_10 = GetReadOnlyAndWriteOnlyString();
    break;
  default:
    pSStack_10 = GetNullString();
  }
  return pSStack_10;
}

Assistant:

static const StringRefType& GetSchemaErrorKeyword(SchemaErrorCode schemaErrorCode) {
        switch (schemaErrorCode) {
            case kSchemaErrorStartUnknown:             return GetStartUnknownString();
            case kSchemaErrorRefPlainName:             return GetRefPlainNameString();
            case kSchemaErrorRefInvalid:               return GetRefInvalidString();
            case kSchemaErrorRefPointerInvalid:        return GetRefPointerInvalidString();
            case kSchemaErrorRefUnknown:               return GetRefUnknownString();
            case kSchemaErrorRefCyclical:              return GetRefCyclicalString();
            case kSchemaErrorRefNoRemoteProvider:      return GetRefNoRemoteProviderString();
            case kSchemaErrorRefNoRemoteSchema:        return GetRefNoRemoteSchemaString();
            case kSchemaErrorRegexInvalid:             return GetRegexInvalidString();
            case kSchemaErrorSpecUnknown:              return GetSpecUnknownString();
            case kSchemaErrorSpecUnsupported:          return GetSpecUnsupportedString();
            case kSchemaErrorSpecIllegal:              return GetSpecIllegalString();
            case kSchemaErrorReadOnlyAndWriteOnly:     return GetReadOnlyAndWriteOnlyString();
            default:                                   return GetNullString();
        }
    }